

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

uint32_t __thiscall Assimp::Ogre::VertexData::VertexSize(VertexData *this,uint16_t source)

{
  bool bVar1;
  reference this_00;
  size_t sVar2;
  VertexElement *element;
  const_iterator __end2;
  const_iterator __begin2;
  VertexElementList *__range2;
  uint32_t size;
  uint16_t source_local;
  VertexData *this_local;
  
  __range2._0_4_ = 0;
  __end2 = std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>::
           begin(&this->vertexElements);
  element = (VertexElement *)
            std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>::
            end(&this->vertexElements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::Ogre::VertexElement_*,_std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>_>
                                *)&element);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Assimp::Ogre::VertexElement_*,_std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>_>
              ::operator*(&__end2);
    if (this_00->source == source) {
      sVar2 = VertexElement::Size(this_00);
      __range2._0_4_ = (int)sVar2 + (uint32_t)__range2;
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::Ogre::VertexElement_*,_std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>_>
    ::operator++(&__end2);
  }
  return (uint32_t)__range2;
}

Assistant:

uint32_t VertexData::VertexSize(uint16_t source) const
{
    uint32_t size = 0;
    for(const auto &element : vertexElements)
    {
        if (element.source == source)
            size += static_cast<uint32_t>(element.Size());
    }
    return size;
}